

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Shutdown(ImGuiContext *context)

{
  ImGuiContext *in_RDI;
  ImGuiContext *unaff_retaddr;
  int i_1;
  int i;
  ImGuiContext *backup_context;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffe0;
  int i_00;
  int i_01;
  ImGuiContext *pIVar1;
  ImGuiContextHookType hook_type;
  
  pIVar1 = in_RDI;
  if (((in_RDI->IO).Fonts != (ImFontAtlas *)0x0) && ((in_RDI->FontAtlasOwnedByContext & 1U) != 0)) {
    ((in_RDI->IO).Fonts)->Locked = false;
    IM_DELETE<ImFontAtlas>((ImFontAtlas *)0x13027d);
  }
  hook_type = (ImGuiContextHookType)((ulong)pIVar1 >> 0x20);
  (in_RDI->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar1 = GImGui;
  if ((in_RDI->Initialized & 1U) != 0) {
    if (((in_RDI->SettingsLoaded & 1U) != 0) && ((in_RDI->IO).IniFilename != (char *)0x0)) {
      SetCurrentContext(in_RDI);
      SaveIniSettingsToDisk(&in_RDI->Initialized);
      SetCurrentContext(pIVar1);
    }
    CallContextHooks(unaff_retaddr,hook_type);
    for (i_01 = 0; i_01 < (in_RDI->Windows).Size; i_01 = i_01 + 1) {
      ImVector<ImGuiWindow_*>::operator[](&in_RDI->Windows,i_01);
      IM_DELETE<ImGuiWindow>((ImGuiWindow *)0x13032c);
    }
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    in_RDI->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear
              ((ImVector<ImGuiWindow_*> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    ImGuiStorage::Clear((ImGuiStorage *)0x13039e);
    in_RDI->NavWindow = (ImGuiWindow *)0x0;
    in_RDI->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    in_RDI->HoveredRootWindow = (ImGuiWindow *)0x0;
    in_RDI->HoveredWindow = (ImGuiWindow *)0x0;
    in_RDI->ActiveIdPreviousFrameWindow = (ImGuiWindow *)0x0;
    in_RDI->ActiveIdWindow = (ImGuiWindow *)0x0;
    in_RDI->MovingWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiColorMod>::clear
              ((ImVector<ImGuiColorMod> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    ImVector<ImGuiStyleMod>::clear
              ((ImVector<ImGuiStyleMod> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    ImVector<ImFont_*>::clear((ImVector<ImFont_*> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    ImVector<ImGuiPopupData>::clear
              ((ImVector<ImGuiPopupData> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    ImVector<ImGuiPopupData>::clear
              ((ImVector<ImGuiPopupData> *)CONCAT44(i_01,in_stack_ffffffffffffffe0));
    for (i_00 = 0; i_00 < (in_RDI->Viewports).Size; i_00 = i_00 + 1) {
      ImVector<ImGuiViewportP_*>::operator[](&in_RDI->Viewports,i_00);
      IM_DELETE<ImGuiViewportP>((ImGuiViewportP *)0x130499);
    }
    ImVector<ImGuiViewportP_*>::clear((ImVector<ImGuiViewportP_*> *)CONCAT44(i_01,i_00));
    ImPool<ImGuiTabBar>::Clear((ImPool<ImGuiTabBar> *)CONCAT44(i_01,i_00));
    ImVector<ImGuiPtrOrIndex>::clear((ImVector<ImGuiPtrOrIndex> *)CONCAT44(i_01,i_00));
    ImVector<ImGuiShrinkWidthItem>::clear((ImVector<ImGuiShrinkWidthItem> *)CONCAT44(i_01,i_00));
    ImPool<ImGuiTable>::Clear((ImPool<ImGuiTable> *)CONCAT44(i_01,i_00));
    ImVector<ImGuiPtrOrIndex>::clear((ImVector<ImGuiPtrOrIndex> *)CONCAT44(i_01,i_00));
    ImVector<ImDrawChannel>::clear((ImVector<ImDrawChannel> *)CONCAT44(i_01,i_00));
    ImVector<char>::clear((ImVector<char> *)CONCAT44(i_01,i_00));
    ImVector<unsigned_int>::clear((ImVector<unsigned_int> *)CONCAT44(i_01,i_00));
    ImGuiInputTextState::ClearFreeMemory((ImGuiInputTextState *)CONCAT44(i_01,i_00));
    ImChunkStream<ImGuiWindowSettings>::clear((ImChunkStream<ImGuiWindowSettings> *)0x130561);
    ImVector<ImGuiSettingsHandler>::clear((ImVector<ImGuiSettingsHandler> *)CONCAT44(i_01,i_00));
    if (in_RDI->LogFile != (ImFileHandle)0x0) {
      if (in_RDI->LogFile != _stdout) {
        ImFileClose((ImFileHandle)0x1305aa);
      }
      in_RDI->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x1305cb);
    in_RDI->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    for (int i = 0; i < g.Windows.Size; i++)
        IM_DELETE(g.Windows[i]);
    g.Windows.clear();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    for (int i = 0; i < g.Viewports.Size; i++)
        IM_DELETE(g.Viewports[i]);
    g.Viewports.clear();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.Tables.Clear();
    g.CurrentTableStack.clear();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}